

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O2

void __thiscall helics::NetworkCommsInterface::PortAllocator::PortAllocator(PortAllocator *this)

{
  _Rb_tree_header *p_Var1;
  string_view host;
  
  this->startingPort = -1;
  p_Var1 = &(this->usedPort)._M_t._M_impl.super__Rb_tree_header;
  (this->usedPort)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->usedPort)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->usedPort)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->usedPort)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->usedPort)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->nextPorts)._M_t._M_impl.super__Rb_tree_header;
  (this->nextPorts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nextPorts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nextPorts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->nextPorts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->nextPorts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->hosts)._M_t._M_impl.super__Rb_tree_header;
  (this->hosts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->hosts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->hosts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->hosts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->hosts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  host._M_str = "localhost";
  host._M_len = 9;
  addNewHost(this,host);
  return;
}

Assistant:

NetworkCommsInterface::PortAllocator::PortAllocator()
{
    addNewHost(localHostString);
}